

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

void GiveInventory(AActor *activator,char *type,int amount)

{
  bool bVar1;
  int iVar2;
  PClassActor *ti;
  char *format;
  int i;
  char *name;
  long lVar3;
  undefined8 *puVar4;
  
  if (type == (char *)0x0 || amount < 1) {
    return;
  }
  iVar2 = strcasecmp(type,"Armor");
  name = "BasicArmorPickup";
  if (iVar2 != 0) {
    name = type;
  }
  ti = PClass::FindActor(name);
  if (ti == (PClassActor *)0x0) {
    format = "ACS: I don\'t know what %s is.\n";
  }
  else {
    bVar1 = PClass::IsAncestorOf(AInventory::RegistrationInfo.MyClass,&ti->super_PClass);
    if (bVar1) {
      if (activator == (AActor *)0x0) {
        puVar4 = &players;
        for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
          if (playeringame[lVar3] == true) {
            (**(code **)(*(long *)*puVar4 + 0xd0))((long *)*puVar4,ti,amount,0);
          }
          puVar4 = puVar4 + 0x54;
        }
        return;
      }
      (*(activator->super_DThinker).super_DObject._vptr_DObject[0x1a])
                (activator,ti,(ulong)(uint)amount,0);
      return;
    }
    format = "ACS: %s is not an inventory item.\n";
  }
  Printf(format,name);
  return;
}

Assistant:

static void GiveInventory (AActor *activator, const char *type, int amount)
{
	PClassActor *info;

	if (amount <= 0 || type == NULL)
	{
		return;
	}
	if (stricmp (type, "Armor") == 0)
	{
		type = "BasicArmorPickup";
	}
	info = PClass::FindActor(type);
	if (info == NULL)
	{
		Printf ("ACS: I don't know what %s is.\n", type);
	}
	else if (!info->IsDescendantOf (RUNTIME_CLASS(AInventory)))
	{
		Printf ("ACS: %s is not an inventory item.\n", type);
	}
	else if (activator == NULL)
	{
		for (int i = 0; i < MAXPLAYERS; ++i)
		{
			if (playeringame[i])
				players[i].mo->GiveInventory(static_cast<PClassInventory *>(info), amount);
		}
	}
	else
	{
		activator->GiveInventory(static_cast<PClassInventory *>(info), amount);
	}
}